

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

void __thiscall
notch::io::PlainTextNetworkWriter::saveWeightsAndBias
          (PlainTextNetworkWriter *this,Array *weights,Array *bias)

{
  ulong uVar1;
  ulong uVar2;
  ostream *poVar3;
  ulong uVar4;
  size_t c;
  ulong uVar5;
  
  uVar1 = bias->_M_size;
  uVar2 = weights->_M_size / uVar1;
  for (uVar4 = 0; uVar4 != uVar1; uVar4 = uVar4 + 1) {
    std::operator<<((ostream *)this->out,"   ");
    poVar3 = std::operator<<((ostream *)this->out," ");
    std::ostream::operator<<(poVar3,bias->_M_data[uVar4]);
    for (uVar5 = 0; uVar5 < uVar2; uVar5 = uVar5 + 1) {
      poVar3 = std::operator<<((ostream *)this->out," ");
      std::ostream::operator<<(poVar3,weights->_M_data[uVar4 * uVar2 + uVar5]);
    }
    std::operator<<((ostream *)this->out,"\n");
  }
  return;
}

Assistant:

void saveWeightsAndBias(const Array &weights, const Array &bias) {
        size_t nOutputs = bias.size();
        size_t nInputs = weights.size() / nOutputs;
        for (size_t r = 0; r < nOutputs; ++r) {
            out << "   ";
            out << " " << bias[r];
            for (size_t c = 0; c < nInputs; ++c) {
                out << " " << weights[r*nInputs + c];
            }
            out << "\n";
        }
    }